

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

void __thiscall SimpleString::copyToBuffer(SimpleString *this,char *bufferToCopy,size_t bufferSize)

{
  size_t sVar1;
  ulong n;
  
  if (bufferSize != 0 && bufferToCopy != (char *)0x0) {
    sVar1 = size(this);
    n = bufferSize - 1;
    if (sVar1 <= bufferSize - 1) {
      n = sVar1;
    }
    StrNCpy(bufferToCopy,this->buffer_,n);
    bufferToCopy[n] = '\0';
  }
  return;
}

Assistant:

void SimpleString::copyToBuffer(char* bufferToCopy, size_t bufferSize) const
{
    if (bufferToCopy == NULLPTR || bufferSize == 0) return;

    size_t sizeToCopy = (bufferSize-1 < size()) ? (bufferSize-1) : size();

    StrNCpy(bufferToCopy, getBuffer(), sizeToCopy);
    bufferToCopy[sizeToCopy] = '\0';
}